

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexer.cc
# Opt level: O0

Token __thiscall flow::lang::Lexer::parseEnvVar(Lexer *this)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  bool bVar4;
  char *value;
  Lexer *this_local;
  
  std::__cxx11::string::clear();
  nextChar(this,true);
  while( true ) {
    bVar1 = eof(this);
    bVar4 = false;
    if (!bVar1) {
      iVar2 = currentChar(this);
      bVar4 = true;
      if (iVar2 != 0x5f) {
        iVar2 = currentChar(this);
        iVar2 = isalnum(iVar2);
        bVar4 = iVar2 != 0;
      }
    }
    if (!bVar4) break;
    iVar2 = currentChar(this);
    std::__cxx11::string::operator+=((string *)&this->stringValue_,(char)iVar2);
    nextChar(this,true);
  }
  pcVar3 = (char *)std::__cxx11::string::c_str();
  pcVar3 = getenv(pcVar3);
  if (pcVar3 == (char *)0x0) {
    std::__cxx11::string::clear();
  }
  else {
    std::__cxx11::string::operator=((string *)&this->stringValue_,pcVar3);
  }
  return String;
}

Assistant:

Token Lexer::parseEnvVar() {
  stringValue_.clear();
  nextChar(); // skip leading '$'

  while (!eof() && (currentChar() == '_' || std::isalnum(currentChar()))) {
    stringValue_ += static_cast<char>(currentChar());
    nextChar();
  }

  if (char* value = getenv(stringValue_.c_str()); value != nullptr) {
    stringValue_ = value;
  } else {
    stringValue_.clear();
  }

  return Token::String;
}